

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

void slang::ast::createCondGenBlock
               (Compilation *compilation,SyntaxNode *syntax,ASTContext *context,
               uint32_t constructIndex,bool isInstantiated,
               SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
               SmallVectorBase<slang::ast::GenerateBlockSymbol_*> *results)

{
  IfGenerateSyntax *syntax_00;
  CaseGenerateSyntax *syntax_01;
  GenerateBlockSymbol *this;
  Scope *scope;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  GenerateBlockSymbol *block;
  SourceLocation loc;
  string_view name;
  bool local_65;
  uint32_t local_64;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_60;
  Token local_58;
  SourceLocation local_48;
  string_view local_40;
  
  local_65 = isInstantiated;
  local_64 = constructIndex;
  if (syntax->kind == CaseGenerate) {
    syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::CaseGenerateSyntax>(syntax);
    GenerateBlockSymbol::fromSyntax
              (compilation,syntax_01,context,constructIndex,isInstantiated,results);
    return;
  }
  if (syntax->kind == IfGenerate) {
    syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::IfGenerateSyntax>(syntax);
    GenerateBlockSymbol::fromSyntax
              (compilation,syntax_00,context,constructIndex,isInstantiated,results);
    return;
  }
  local_60 = attributes;
  local_40 = getGenerateBlockName(syntax);
  local_58 = slang::syntax::SyntaxNode::getFirstToken(syntax);
  local_48 = parsing::Token::location(&local_58);
  this = BumpAllocator::
         emplace<slang::ast::GenerateBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&,bool&>
                   (&compilation->super_BumpAllocator,compilation,&local_40,&local_48,&local_64,
                    &local_65);
  local_58._0_8_ = this;
  (this->super_Symbol).originatingSyntax = syntax;
  scope = not_null<const_slang::ast::Scope_*>::get(&context->scope);
  syntax_02 = slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)local_60);
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_02);
  SmallVectorBase<slang::ast::GenerateBlockSymbol*>::
  emplace_back<slang::ast::GenerateBlockSymbol*const&>
            ((SmallVectorBase<slang::ast::GenerateBlockSymbol*> *)results,
             (GenerateBlockSymbol **)&local_58);
  if (local_65 == true) {
    addBlockMembers((GenerateBlockSymbol *)local_58._0_8_,syntax);
  }
  return;
}

Assistant:

static void createCondGenBlock(Compilation& compilation, const SyntaxNode& syntax,
                               const ASTContext& context, uint32_t constructIndex,
                               bool isInstantiated,
                               const SyntaxList<AttributeInstanceSyntax>& attributes,
                               SmallVectorBase<GenerateBlockSymbol*>& results) {
    // [27.5] If a generate block in a conditional generate construct consists of only one item
    // that is itself a conditional generate construct and if that item is not surrounded by
    // begin-end keywords, then this generate block is not treated as a separate scope. The
    // generate construct within this block is said to be directly nested. The generate blocks
    // of the directly nested construct are treated as if they belong to the outer construct.
    switch (syntax.kind) {
        case SyntaxKind::IfGenerate:
            GenerateBlockSymbol::fromSyntax(compilation, syntax.as<IfGenerateSyntax>(), context,
                                            constructIndex, isInstantiated, results);
            return;
        case SyntaxKind::CaseGenerate:
            GenerateBlockSymbol::fromSyntax(compilation, syntax.as<CaseGenerateSyntax>(), context,
                                            constructIndex, isInstantiated, results);
            return;
        default:
            break;
    }

    string_view name = getGenerateBlockName(syntax);
    SourceLocation loc = syntax.getFirstToken().location();

    auto block = compilation.emplace<GenerateBlockSymbol>(compilation, name, loc, constructIndex,
                                                          isInstantiated);
    block->setSyntax(syntax);
    block->setAttributes(*context.scope, attributes);
    results.push_back(block);

    if (isInstantiated)
        addBlockMembers(*block, syntax);
}